

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::nonbasicValue(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *__return_storage_ptr__,
               SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  Status SVar1;
  pointer pnVar2;
  pointer pnVar3;
  long lVar4;
  ulong uVar5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  val;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&local_70);
  if (this->m_nonbasicValueUpToDate == true) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (&__return_storage_ptr__->m_backend,&(this->m_nonbasicValue).m_backend);
  }
  else {
    local_38 = __return_storage_ptr__;
    if (this->theRep == COLUMN) {
      uVar5 = (ulong)(uint)(this->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set.thenum;
      if (this->theType == LEAVE) {
        lVar4 = uVar5 * 0x38;
        for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
          SVar1 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[uVar5 - 1];
          if (SVar1 == P_FIXED) {
            pnVar3 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
LAB_0020c104:
            pnVar2 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
LAB_0020c10e:
            local_a8.fpclass = cpp_dec_float_finite;
            local_a8.prec_elem = 10;
            local_a8.data._M_elems[0] = 0;
            local_a8.data._M_elems[1] = 0;
            local_a8.data._M_elems[2] = 0;
            local_a8.data._M_elems[3] = 0;
            local_a8.data._M_elems[4] = 0;
            local_a8.data._M_elems[5] = 0;
            local_a8.data._M_elems._24_5_ = 0;
            local_a8.data._M_elems[7]._1_3_ = 0;
            local_a8.data._M_elems._32_5_ = 0;
            local_a8._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_a8,
                       (cpp_dec_float<50U,_int,_void> *)((long)&pnVar3[-1].m_backend.data + lVar4),
                       (cpp_dec_float<50U,_int,_void> *)((long)&pnVar2[-1].m_backend.data + lVar4));
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_70,&local_a8);
          }
          else {
            if (SVar1 == P_ON_LOWER) {
              pnVar3 = (this->theLCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_0020c104;
            }
            if (SVar1 == P_ON_UPPER) {
              pnVar3 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar2 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .up.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_0020c10e;
            }
          }
          lVar4 = lVar4 + -0x38;
        }
        uVar5 = (ulong)(uint)(this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set.thenum;
        lVar4 = uVar5 * 0x38;
        for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
          SVar1 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.rowstat.data[uVar5 - 1];
          if (SVar1 == P_FIXED) {
            pnVar3 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
LAB_0020c3e8:
            pnVar2 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
LAB_0020c3ef:
            local_a8.fpclass = cpp_dec_float_finite;
            local_a8.prec_elem = 10;
            local_a8.data._M_elems[0] = 0;
            local_a8.data._M_elems[1] = 0;
            local_a8.data._M_elems[2] = 0;
            local_a8.data._M_elems[3] = 0;
            local_a8.data._M_elems[4] = 0;
            local_a8.data._M_elems[5] = 0;
            local_a8.data._M_elems._24_5_ = 0;
            local_a8.data._M_elems[7]._1_3_ = 0;
            local_a8.data._M_elems._32_5_ = 0;
            local_a8._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_a8,
                       (cpp_dec_float<50U,_int,_void> *)((long)&pnVar3[-1].m_backend.data + lVar4),
                       (cpp_dec_float<50U,_int,_void> *)((long)&pnVar2[-1].m_backend.data + lVar4));
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_70,&local_a8);
          }
          else {
            if (SVar1 == P_ON_LOWER) {
              pnVar3 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_0020c3e8;
            }
            if (SVar1 == P_ON_UPPER) {
              pnVar3 = (this->theLRbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar2 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_0020c3ef;
            }
          }
          lVar4 = lVar4 + -0x38;
        }
      }
      else {
        lVar4 = uVar5 * 0x38;
        for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
          SVar1 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[uVar5 - 1];
          if ((SVar1 == P_FIXED) || (SVar1 == P_ON_LOWER)) {
            pnVar2 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar3 = (this->theLCbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
LAB_0020c35a:
            local_a8.fpclass = cpp_dec_float_finite;
            local_a8.prec_elem = 10;
            local_a8.data._M_elems[0] = 0;
            local_a8.data._M_elems[1] = 0;
            local_a8.data._M_elems[2] = 0;
            local_a8.data._M_elems[3] = 0;
            local_a8.data._M_elems[4] = 0;
            local_a8.data._M_elems[5] = 0;
            local_a8.data._M_elems._24_5_ = 0;
            local_a8.data._M_elems[7]._1_3_ = 0;
            local_a8.data._M_elems._32_5_ = 0;
            local_a8._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_a8,
                       (cpp_dec_float<50U,_int,_void> *)((long)&pnVar2[-1].m_backend.data + lVar4),
                       (cpp_dec_float<50U,_int,_void> *)((long)&pnVar3[-1].m_backend.data + lVar4));
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_70,&local_a8);
          }
          else if (SVar1 == P_ON_UPPER) {
            pnVar2 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar3 = (this->theUCbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_0020c35a;
          }
          lVar4 = lVar4 + -0x38;
        }
        uVar5 = (ulong)(uint)(this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set.thenum;
        lVar4 = uVar5 * 0x38;
        for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
          SVar1 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.rowstat.data[uVar5 - 1];
          if ((SVar1 == P_FIXED) || (SVar1 == P_ON_LOWER)) {
            pnVar2 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar3 = (this->theURbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
LAB_0020c47d:
            local_a8.fpclass = cpp_dec_float_finite;
            local_a8.prec_elem = 10;
            local_a8.data._M_elems[0] = 0;
            local_a8.data._M_elems[1] = 0;
            local_a8.data._M_elems[2] = 0;
            local_a8.data._M_elems[3] = 0;
            local_a8.data._M_elems[4] = 0;
            local_a8.data._M_elems[5] = 0;
            local_a8.data._M_elems._24_5_ = 0;
            local_a8.data._M_elems[7]._1_3_ = 0;
            local_a8.data._M_elems._32_5_ = 0;
            local_a8._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_a8,
                       (cpp_dec_float<50U,_int,_void> *)((long)&pnVar2[-1].m_backend.data + lVar4),
                       (cpp_dec_float<50U,_int,_void> *)((long)&pnVar3[-1].m_backend.data + lVar4));
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_70,&local_a8);
          }
          else if (SVar1 == P_ON_UPPER) {
            pnVar2 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar3 = (this->theLRbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_0020c47d;
          }
          lVar4 = lVar4 + -0x38;
        }
      }
    }
    else {
      uVar5 = (ulong)(uint)(this->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set.thenum;
      lVar4 = uVar5 * 0x38;
      for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
        SVar1 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[uVar5 - 1];
        if (SVar1 == D_ON_BOTH) {
          local_a8.fpclass = cpp_dec_float_finite;
          local_a8.prec_elem = 10;
          local_a8.data._M_elems[0] = 0;
          local_a8.data._M_elems[1] = 0;
          local_a8.data._M_elems[2] = 0;
          local_a8.data._M_elems[3] = 0;
          local_a8.data._M_elems[4] = 0;
          local_a8.data._M_elems[5] = 0;
          local_a8.data._M_elems._24_5_ = 0;
          local_a8.data._M_elems[7]._1_3_ = 0;
          local_a8.data._M_elems._32_5_ = 0;
          local_a8._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_a8,
                     (cpp_dec_float<50U,_int,_void> *)
                     ((long)&(this->theLCbound).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar4),
                     (cpp_dec_float<50U,_int,_void> *)
                     ((long)&(this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .up.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar4));
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_70,&local_a8);
LAB_0020c1de:
          pnVar2 = (this->theUCbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar3 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
LAB_0020c1ef:
          local_a8.fpclass = cpp_dec_float_finite;
          local_a8.prec_elem = 10;
          local_a8.data._M_elems[0] = 0;
          local_a8.data._M_elems[1] = 0;
          local_a8.data._M_elems[2] = 0;
          local_a8.data._M_elems[3] = 0;
          local_a8.data._M_elems[4] = 0;
          local_a8.data._M_elems[5] = 0;
          local_a8.data._M_elems._24_5_ = 0;
          local_a8.data._M_elems[7]._1_3_ = 0;
          local_a8.data._M_elems._32_5_ = 0;
          local_a8._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_a8,
                     (cpp_dec_float<50U,_int,_void> *)((long)&pnVar2[-1].m_backend.data + lVar4),
                     (cpp_dec_float<50U,_int,_void> *)((long)&pnVar3[-1].m_backend.data + lVar4));
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_70,&local_a8);
        }
        else {
          if (SVar1 == D_ON_LOWER) {
            pnVar2 = (this->theLCbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar3 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_0020c1ef;
          }
          if (SVar1 == D_ON_UPPER) goto LAB_0020c1de;
        }
        lVar4 = lVar4 + -0x38;
      }
      uVar5 = (ulong)(uint)(this->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set.thenum;
      lVar4 = uVar5 * 0x38;
      for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
        SVar1 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[uVar5 - 1];
        if (SVar1 == D_ON_BOTH) {
          local_a8.fpclass = cpp_dec_float_finite;
          local_a8.prec_elem = 10;
          local_a8.data._M_elems[0] = 0;
          local_a8.data._M_elems[1] = 0;
          local_a8.data._M_elems[2] = 0;
          local_a8.data._M_elems[3] = 0;
          local_a8.data._M_elems[4] = 0;
          local_a8.data._M_elems[5] = 0;
          local_a8.data._M_elems._24_5_ = 0;
          local_a8.data._M_elems[7]._1_3_ = 0;
          local_a8.data._M_elems._32_5_ = 0;
          local_a8._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_a8,
                     (cpp_dec_float<50U,_int,_void> *)
                     ((long)&(this->theLRbound).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar4),
                     (cpp_dec_float<50U,_int,_void> *)
                     ((long)&(this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .right.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar4));
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_70,&local_a8);
LAB_0020c2b2:
          pnVar2 = (this->theURbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar3 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
LAB_0020c2c0:
          local_a8.fpclass = cpp_dec_float_finite;
          local_a8.prec_elem = 10;
          local_a8.data._M_elems[0] = 0;
          local_a8.data._M_elems[1] = 0;
          local_a8.data._M_elems[2] = 0;
          local_a8.data._M_elems[3] = 0;
          local_a8.data._M_elems[4] = 0;
          local_a8.data._M_elems[5] = 0;
          local_a8.data._M_elems._24_5_ = 0;
          local_a8.data._M_elems[7]._1_3_ = 0;
          local_a8.data._M_elems._32_5_ = 0;
          local_a8._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_a8,
                     (cpp_dec_float<50U,_int,_void> *)((long)&pnVar2[-1].m_backend.data + lVar4),
                     (cpp_dec_float<50U,_int,_void> *)((long)&pnVar3[-1].m_backend.data + lVar4));
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_70,&local_a8);
        }
        else {
          if (SVar1 == D_ON_LOWER) {
            pnVar2 = (this->theLRbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar3 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_0020c2c0;
          }
          if (SVar1 == D_ON_UPPER) goto LAB_0020c2b2;
        }
        lVar4 = lVar4 + -0x38;
      }
    }
    if (this->m_nonbasicValueUpToDate == false) {
      *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 8) =
           local_70.data._M_elems._32_8_;
      *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 4) =
           local_70.data._M_elems._16_8_;
      *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 6) =
           local_70.data._M_elems._24_8_;
      *(undefined8 *)(this->m_nonbasicValue).m_backend.data._M_elems = local_70.data._M_elems._0_8_;
      *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 2) =
           local_70.data._M_elems._8_8_;
      (this->m_nonbasicValue).m_backend.exp = local_70.exp;
      (this->m_nonbasicValue).m_backend.neg = local_70.neg;
      (this->m_nonbasicValue).m_backend.fpclass = local_70.fpclass;
      (this->m_nonbasicValue).m_backend.prec_elem = local_70.prec_elem;
      this->m_nonbasicValueUpToDate = true;
    }
    *(undefined8 *)((local_38->m_backend).data._M_elems + 8) = local_70.data._M_elems._32_8_;
    *(undefined8 *)((local_38->m_backend).data._M_elems + 4) = local_70.data._M_elems._16_8_;
    *(undefined8 *)((local_38->m_backend).data._M_elems + 6) = local_70.data._M_elems._24_8_;
    *(undefined8 *)(local_38->m_backend).data._M_elems = local_70.data._M_elems._0_8_;
    *(undefined8 *)((local_38->m_backend).data._M_elems + 2) = local_70.data._M_elems._8_8_;
    (local_38->m_backend).exp = local_70.exp;
    (local_38->m_backend).neg = local_70.neg;
    (local_38->m_backend).fpclass = local_70.fpclass;
    (local_38->m_backend).prec_elem = local_70.prec_elem;
    __return_storage_ptr__ = local_38;
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::nonbasicValue()
   {
      int i;
      StableSum<R> val;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

#ifndef ENABLE_ADDITIONAL_CHECKS

      // if the value is available we don't need to recompute it
      if(m_nonbasicValueUpToDate)
         return m_nonbasicValue;

#endif

      if(rep() == COLUMN)
      {
         if(type() == LEAVE)
         {
            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theUCbound[i] * SPxLPBase<R>::upper(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::upper(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theLCbound[i] * SPxLPBase<R>::lower(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lower(i), SPxLPBase<R>::upper(i), this->epsilon()));
                  val += this->maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theLRbound[i] * SPxLPBase<R>::rhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theURbound[i] * SPxLPBase<R>::lhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lhs(i), SPxLPBase<R>::rhs(i), this->epsilon()));
                  val += this->maxRowObj(i) * SPxLPBase<R>::lhs(i);
                  break;

               default:
                  break;
               }
            }
         }
         else
         {
            assert(type() == ENTER);

            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxObj(i) * theUCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLCbound[i], theUCbound[i], this->epsilon()));
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxRowObj(i) * theLRbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLRbound[i], theURbound[i], this->epsilon()));
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               default:
                  break;
               }
            }
         }
      }
      else
      {
         assert(rep() == ROW);
         assert(type() == ENTER);

         for(i = this->nCols() - 1; i >= 0; --i)
         {
            switch(ds.colStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theUCbound[i] * this->lower(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLCbound[i] * this->upper(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLCbound[i] * this->upper(i);
               val += theUCbound[i] * this->lower(i);
               break;

            default:
               break;
            }
         }

         for(i = this->nRows() - 1; i >= 0; --i)
         {
            switch(ds.rowStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theURbound[i] * this->lhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLRbound[i] * this->rhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLRbound[i] * this->rhs(i);
               val += theURbound[i] * this->lhs(i);
               break;

            default:
               break;
            }
         }
      }

#ifdef ENABLE_ADDITIONAL_CHECKS

      if(m_nonbasicValueUpToDate && NE(m_nonbasicValue, val))
      {
         SPX_MSG_ERROR(std::cerr << "stored nonbasic value: " << m_nonbasicValue
                       << ", correct nonbasic value: " << val
                       << ", violation: " << val - m_nonbasicValue << std::endl;)
         assert(EQrel(m_nonbasicValue, val, 1e-12));
      }

#endif

      if(!m_nonbasicValueUpToDate)
      {
         m_nonbasicValue = R(val);
         m_nonbasicValueUpToDate = true;
      }

      return val;
   }